

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfo * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  BBox1f BVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  char *pcVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  undefined4 uVar10;
  BBox3fa *pBVar11;
  ulong uVar12;
  ulong uVar13;
  anon_class_16_2_07cfa4d6 *paVar14;
  size_t *psVar15;
  long lVar16;
  size_t sVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar38;
  float fVar39;
  undefined1 auVar35 [16];
  float fVar40;
  undefined1 auVar36 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar37;
  float fVar44;
  float fVar45;
  undefined1 auVar41 [16];
  float fVar46;
  undefined1 auVar42 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar43;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  size_t local_190;
  size_t local_178;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  ulong local_110;
  anon_class_16_2_07cfa4d6 local_108;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_f8;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  local_138._8_8_ = 0x7f8000007f800000;
  local_138._0_8_ = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  local_148._8_8_ = 0xff800000ff800000;
  local_148._0_8_ = 0xff800000ff800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  fVar2 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          super_Geometry.time_range.lower;
  fVar3 = time_range->lower;
  if (time_range->lower <= fVar2) {
    fVar3 = fVar2;
  }
  fVar2 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          super_Geometry.time_range.upper;
  if (time_range->upper <= fVar2) {
    fVar2 = time_range->upper;
  }
  if (fVar3 <= fVar2) {
    uVar13 = r->_begin;
    if (uVar13 < r->_end) {
      local_190 = 0;
      local_168._8_8_ = 0x7f8000007f800000;
      local_168._0_8_ = 0x7f8000007f800000;
      local_138._8_8_ = 0x7f8000007f800000;
      local_138._0_8_ = 0x7f8000007f800000;
      local_158._8_8_ = 0xff800000ff800000;
      local_158._0_8_ = 0xff800000ff800000;
      local_148._8_8_ = 0xff800000ff800000;
      local_148._0_8_ = 0xff800000ff800000;
      local_178 = k;
      do {
        BVar4 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                super_Geometry.time_range;
        auVar36._8_4_ = BVar4.lower;
        fVar34 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 super_Geometry.fnumTimeSegments;
        fVar27 = BVar4.upper - auVar36._8_4_;
        auVar36._4_4_ = floorf(((fVar3 - auVar36._8_4_) / fVar27) * 1.0000002 * fVar34);
        auVar36._0_4_ = ceilf(((fVar2 - auVar36._8_4_) / fVar27) * 0.99999976 * fVar34);
        uVar19 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                     super_CurveGeometry.super_Geometry.field_0x58 +
                          *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                    super_CurveGeometry.field_0x68 * uVar13);
        pBVar5 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 vertices.items;
        if ((ulong)(uVar19 + 3) < (pBVar5->super_RawBufferView).num) {
          fVar32 = 0.0;
          if (0.0 <= auVar36._4_4_) {
            fVar32 = auVar36._4_4_;
          }
          if (fVar34 <= auVar36._0_4_) {
            auVar36._0_4_ = fVar34;
          }
          if ((uint)(int)fVar32 <= (uint)(int)auVar36._0_4_) {
            uVar12 = (ulong)(int)fVar32;
            psVar15 = &pBVar5[uVar12].super_RawBufferView.stride;
            paVar14 = &local_108;
            do {
              pcVar6 = ((RawBufferView *)(psVar15 + -2))->ptr_ofs;
              sVar17 = *psVar15;
              lVar21 = sVar17 * (uVar19 + 1);
              lVar18 = sVar17 * (uVar19 + 2);
              lVar16 = sVar17 * (uVar19 + 3);
              auVar42._4_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar6 + lVar21 + 0xc)));
              auVar42._0_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar6 + sVar17 * uVar19 + 0xc)));
              auVar42._8_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar6 + lVar18 + 0xc)));
              auVar42._12_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar6 + lVar16 + 0xc)));
              iVar20 = movmskps((int)paVar14,auVar42);
              if (iVar20 != 0) goto LAB_009d3762;
              pfVar1 = (float *)(pcVar6 + sVar17 * uVar19);
              auVar30._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
              auVar30._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
              auVar30._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
              auVar30._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
              uVar10 = movmskps(0,auVar30);
              if ((~(byte)uVar10 & 7) != 0) goto LAB_009d3762;
              pfVar1 = (float *)(pcVar6 + lVar21);
              auVar22._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
              auVar22._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
              auVar22._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
              auVar22._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
              uVar10 = movmskps(CONCAT31((int3)((uint)uVar10 >> 8),~(byte)uVar10),auVar22);
              if ((~(byte)uVar10 & 7) != 0) goto LAB_009d3762;
              pfVar1 = (float *)(pcVar6 + lVar18);
              auVar23._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
              auVar23._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
              auVar23._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
              auVar23._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
              uVar10 = movmskps(CONCAT31((int3)((uint)uVar10 >> 8),~(byte)uVar10),auVar23);
              paVar14 = (anon_class_16_2_07cfa4d6 *)
                        (ulong)CONCAT31((int3)((uint)uVar10 >> 8),~(byte)uVar10);
              if ((~(byte)uVar10 & 7) != 0) goto LAB_009d3762;
              pfVar1 = (float *)(pcVar6 + lVar16);
              auVar24._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
              auVar24._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
              auVar24._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
              auVar24._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
              uVar10 = movmskps((int)pcVar6,auVar24);
              if ((~(byte)uVar10 & 7) != 0) goto LAB_009d3762;
              uVar12 = uVar12 + 1;
              psVar15 = psVar15 + 7;
            } while (uVar12 <= (ulong)(long)(int)auVar36._0_4_);
          }
          local_108.primID = &local_110;
          fVar32 = (fVar3 - auVar36._8_4_) / fVar27;
          fVar27 = (fVar2 - auVar36._8_4_) / fVar27;
          auVar36._8_4_ = fVar34 * fVar27;
          local_110 = uVar13;
          local_108.this = this;
          auVar36._0_4_ = floorf(fVar34 * fVar32);
          auVar36._4_4_ = ceilf(auVar36._8_4_);
          uVar19 = (uint)auVar36._0_4_;
          if (auVar36._0_4_ <= 0.0) {
            auVar36._0_4_ = 0.0;
          }
          auVar28._12_4_ = auVar36._4_4_;
          if (fVar34 <= auVar36._4_4_) {
            auVar28._12_4_ = fVar34;
          }
          if ((int)uVar19 < 0) {
            uVar19 = 0xffffffff;
          }
          iVar20 = (int)fVar34 + 1;
          if ((int)auVar36._4_4_ < (int)fVar34 + 1) {
            iVar20 = (int)auVar36._4_4_;
          }
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_d8.field_1,&local_108,(long)(int)auVar36._0_4_);
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_f8.field_1,&local_108,(long)(int)auVar28._12_4_);
          auVar36._4_4_ = fVar34 * fVar32 - auVar36._0_4_;
          if (iVar20 - uVar19 == 1) {
            if (auVar36._4_4_ <= 0.0) {
              auVar36._4_4_ = 0.0;
            }
            fVar34 = 1.0 - auVar36._4_4_;
            auVar41._0_4_ = fVar34 * local_d8.m128[0] + auVar36._4_4_ * local_f8.m128[0];
            auVar41._4_4_ = fVar34 * local_d8.m128[1] + auVar36._4_4_ * local_f8.m128[1];
            auVar41._8_4_ = fVar34 * local_d8.m128[2] + auVar36._4_4_ * local_f8.m128[2];
            auVar41._12_4_ = fVar34 * local_d8.m128[3] + auVar36._4_4_ * local_f8.m128[3];
            auVar35._0_4_ = fVar34 * local_c8 + auVar36._4_4_ * local_e8;
            auVar35._4_4_ = fVar34 * fStack_c4 + auVar36._4_4_ * fStack_e4;
            auVar35._8_4_ = fVar34 * fStack_c0 + auVar36._4_4_ * fStack_e0;
            auVar35._12_4_ = fVar34 * fStack_bc + auVar36._4_4_ * fStack_dc;
            auVar28._12_4_ = auVar28._12_4_ - auVar36._8_4_;
            if (auVar28._12_4_ <= 0.0) {
              auVar28._12_4_ = 0.0;
            }
            fVar34 = 1.0 - auVar28._12_4_;
            auVar36._0_4_ = local_f8.m128[0] * fVar34 + local_d8.m128[0] * auVar28._12_4_;
            auVar36._4_4_ = local_f8.m128[1] * fVar34 + local_d8.m128[1] * auVar28._12_4_;
            auVar36._8_4_ = local_f8.m128[2] * fVar34 + local_d8.m128[2] * auVar28._12_4_;
            auVar36._12_4_ = local_f8.m128[3] * fVar34 + local_d8.m128[3] * auVar28._12_4_;
            auVar28._0_4_ = fVar34 * local_e8 + auVar28._12_4_ * local_c8;
            auVar28._4_4_ = fVar34 * fStack_e4 + auVar28._12_4_ * fStack_c4;
            auVar28._8_4_ = fVar34 * fStack_e0 + auVar28._12_4_ * fStack_c0;
            auVar28._12_4_ = fVar34 * fStack_dc + auVar28._12_4_ * fStack_bc;
            uVar9 = 1;
          }
          else {
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_58.field_1,&local_108,(long)((int)auVar36._0_4_ + 1));
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_78.field_1,&local_108,(long)((int)auVar28._12_4_ + -1));
            if (auVar36._4_4_ <= 0.0) {
              auVar36._4_4_ = 0.0;
            }
            auVar36._0_4_ = 1.0 - auVar36._4_4_;
            auVar41._0_4_ = local_d8.m128[0] * auVar36._0_4_ + local_58.m128[0] * auVar36._4_4_;
            auVar41._4_4_ = local_d8.m128[1] * auVar36._0_4_ + local_58.m128[1] * auVar36._4_4_;
            auVar41._8_4_ = local_d8.m128[2] * auVar36._0_4_ + local_58.m128[2] * auVar36._4_4_;
            auVar41._12_4_ = local_d8.m128[3] * auVar36._0_4_ + local_58.m128[3] * auVar36._4_4_;
            auVar35._0_4_ = auVar36._0_4_ * local_c8 + auVar36._4_4_ * local_48;
            auVar35._4_4_ = auVar36._0_4_ * fStack_c4 + auVar36._4_4_ * fStack_44;
            auVar35._8_4_ = auVar36._0_4_ * fStack_c0 + auVar36._4_4_ * fStack_40;
            auVar35._12_4_ = auVar36._0_4_ * fStack_bc + auVar36._4_4_ * fStack_3c;
            auVar28._12_4_ = auVar28._12_4_ - auVar36._8_4_;
            if (auVar28._12_4_ <= 0.0) {
              auVar28._12_4_ = 0.0;
            }
            fVar33 = 1.0 - auVar28._12_4_;
            auVar36._0_4_ = local_f8.m128[0] * fVar33 + local_78.m128[0] * auVar28._12_4_;
            auVar36._4_4_ = local_f8.m128[1] * fVar33 + local_78.m128[1] * auVar28._12_4_;
            auVar36._8_4_ = local_f8.m128[2] * fVar33 + local_78.m128[2] * auVar28._12_4_;
            auVar36._12_4_ = local_f8.m128[3] * fVar33 + local_78.m128[3] * auVar28._12_4_;
            auVar28._0_4_ = fVar33 * local_e8 + auVar28._12_4_ * local_68;
            auVar28._4_4_ = fVar33 * fStack_e4 + auVar28._12_4_ * fStack_64;
            auVar28._8_4_ = fVar33 * fStack_e0 + auVar28._12_4_ * fStack_60;
            auVar28._12_4_ = fVar33 * fStack_dc + auVar28._12_4_ * fStack_5c;
            uVar9 = uVar19 + 1;
            if ((int)uVar9 < iVar20) {
              sVar17 = (size_t)uVar9;
              iVar20 = ~uVar19 + iVar20;
              do {
                fVar33 = ((float)(int)sVar17 / fVar34 - fVar32) / (fVar27 - fVar32);
                fVar31 = 1.0 - fVar33;
                fVar44 = auVar41._4_4_;
                fVar45 = auVar41._8_4_;
                fVar46 = auVar41._12_4_;
                fVar38 = auVar35._4_4_;
                fVar39 = auVar35._8_4_;
                fVar40 = auVar35._12_4_;
                local_a8 = fVar31 * auVar35._0_4_ + fVar33 * auVar28._0_4_;
                fStack_a4 = fVar31 * fVar38 + fVar33 * auVar28._4_4_;
                fStack_a0 = fVar31 * fVar39 + fVar33 * auVar28._8_4_;
                fStack_9c = fVar31 * fVar40 + fVar33 * auVar28._12_4_;
                local_b8 = auVar36._0_4_;
                fStack_b4 = auVar36._4_4_;
                fStack_b0 = auVar36._8_4_;
                fStack_ac = auVar36._12_4_;
                pBVar11 = linearBounds::anon_class_16_2_07cfa4d6::operator()
                                    ((BBox3fa *)&local_98.field_1,&local_108,sVar17);
                uVar9 = (uint)pBVar11;
                auVar25._0_4_ = local_98.m128[0] - (auVar41._0_4_ * fVar31 + auVar36._0_4_ * fVar33)
                ;
                auVar25._4_4_ = local_98.m128[1] - (fVar44 * fVar31 + auVar36._4_4_ * fVar33);
                auVar25._8_4_ = local_98.m128[2] - (fVar45 * fVar31 + auVar36._8_4_ * fVar33);
                auVar25._12_4_ = local_98.m128[3] - (fVar46 * fVar31 + auVar36._12_4_ * fVar33);
                auVar29._0_4_ = local_88 - local_a8;
                auVar29._4_4_ = fStack_84 - fStack_a4;
                auVar29._8_4_ = fStack_80 - fStack_a0;
                auVar29._12_4_ = fStack_7c - fStack_9c;
                auVar42 = minps(auVar25,ZEXT816(0));
                auVar30 = maxps(auVar29,ZEXT816(0));
                auVar41._0_4_ = auVar41._0_4_ + auVar42._0_4_;
                auVar41._4_4_ = fVar44 + auVar42._4_4_;
                auVar41._8_4_ = fVar45 + auVar42._8_4_;
                auVar41._12_4_ = fVar46 + auVar42._12_4_;
                auVar36._0_4_ = auVar42._0_4_ + local_b8;
                auVar36._4_4_ = auVar42._4_4_ + fStack_b4;
                auVar36._8_4_ = auVar42._8_4_ + fStack_b0;
                auVar36._12_4_ = auVar42._12_4_ + fStack_ac;
                auVar35._0_4_ = auVar35._0_4_ + auVar30._0_4_;
                auVar35._4_4_ = fVar38 + auVar30._4_4_;
                auVar35._8_4_ = fVar39 + auVar30._8_4_;
                auVar35._12_4_ = fVar40 + auVar30._12_4_;
                auVar28._0_4_ = auVar30._0_4_ + auVar28._0_4_;
                auVar28._4_4_ = auVar30._4_4_ + auVar28._4_4_;
                auVar28._8_4_ = auVar30._8_4_ + auVar28._8_4_;
                auVar28._12_4_ = auVar30._12_4_ + auVar28._12_4_;
                sVar17 = sVar17 + 1;
                iVar20 = iVar20 + -1;
              } while (iVar20 != 0);
            }
            else {
            }
          }
          auVar7._4_4_ = -(uint)(auVar41._4_4_ <= auVar35._4_4_);
          auVar7._0_4_ = -(uint)(auVar41._0_4_ <= auVar35._0_4_);
          auVar7._8_4_ = -(uint)(auVar41._8_4_ <= auVar35._8_4_);
          auVar7._12_4_ = -(uint)(auVar41._12_4_ <= auVar35._12_4_);
          uVar10 = movmskps(uVar9,auVar7);
          if (((~(byte)uVar10 & 7) == 0) &&
             (auVar8._4_4_ = -(uint)(auVar36._4_4_ <= auVar28._4_4_),
             auVar8._0_4_ = -(uint)(auVar36._0_4_ <= auVar28._0_4_),
             auVar8._8_4_ = -(uint)(auVar36._8_4_ <= auVar28._8_4_),
             auVar8._12_4_ = -(uint)(auVar36._12_4_ <= auVar28._12_4_),
             uVar10 = movmskps(CONCAT31((int3)((uint)uVar10 >> 8),~(byte)uVar10),auVar8),
             (~(byte)uVar10 & 7) == 0)) {
            auVar42 = minps(auVar41,auVar36);
            auVar36 = maxps(auVar35,auVar28);
            aVar43._0_12_ = auVar42._0_12_;
            aVar43.m128[3] = (float)geomID;
            aVar37._0_12_ = auVar36._0_12_;
            aVar37.m128[3] = (float)uVar13;
            auVar26._0_4_ = auVar42._0_4_ + auVar36._0_4_;
            auVar26._4_4_ = auVar42._4_4_ + auVar36._4_4_;
            auVar26._8_4_ = auVar42._8_4_ + auVar36._8_4_;
            auVar26._12_4_ = (float)geomID + (float)uVar13;
            local_168 = minps(local_168,(undefined1  [16])aVar43);
            local_158 = maxps(local_158,(undefined1  [16])aVar37);
            local_138 = minps(local_138,auVar26);
            local_148 = maxps(local_148,auVar26);
            local_190 = local_190 + 1;
            prims[local_178].lower.field_0 = aVar43;
            prims[local_178].upper.field_0 = aVar37;
            local_178 = local_178 + 1;
          }
        }
LAB_009d3762:
        uVar13 = uVar13 + 1;
      } while (uVar13 < r->_end);
    }
    else {
      local_190 = 0;
      local_158._8_8_ = 0xff800000ff800000;
      local_158._0_8_ = 0xff800000ff800000;
      local_168._8_8_ = 0x7f8000007f800000;
      local_168._0_8_ = 0x7f8000007f800000;
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_168._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_168._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_158._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_158._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_138._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = local_138._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_148._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_148._8_8_;
    __return_storage_ptr__->end = local_190;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }